

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

int __thiscall AbstractModuleClient::processTimer(AbstractModuleClient *this,int timer_id)

{
  void *pvVar1;
  size_t eventsize;
  int event;
  
  eventsize = 4;
  if (this->timestampsub != (zsock_t *)0x0) {
    std::mutex::lock(&this->tsmutex);
    pvVar1 = zsock_resolve(this->timestampsub);
    zmq_getsockopt(pvVar1,0xf,&event,&eventsize);
    pthread_mutex_unlock((pthread_mutex_t *)&this->tsmutex);
  }
  return 0;
}

Assistant:

int AbstractModuleClient::processTimer(int timer_id){
    int event;
    size_t eventsize = sizeof(event);
    if(timestampsub){
        tsmutex.lock();
        zmq_getsockopt (zsock_resolve(timestampsub), ZMQ_EVENTS, &event, &eventsize);
        tsmutex.unlock();
    }
    return 0;
}